

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jzon.cpp
# Opt level: O1

Node * __thiscall Jzon::Node::operator=(Node *this,Node *rhs)

{
  Data *pDVar1;
  
  if (this != rhs) {
    pDVar1 = this->data;
    if ((pDVar1 != (Data *)0x0) && (pDVar1->refCount = pDVar1->refCount + -1, pDVar1->refCount == 0)
       ) {
      Data::~Data(pDVar1);
      operator_delete(pDVar1);
    }
    pDVar1 = rhs->data;
    this->data = pDVar1;
    if (pDVar1 != (Data *)0x0) {
      pDVar1->refCount = pDVar1->refCount + 1;
    }
  }
  return this;
}

Assistant:

Node &Node::operator=(const Node &rhs)
	{
		if (this != &rhs)
		{
			if (data != NULL && data->release())
			{
				delete data;
			}
			data = rhs.data;
			if (data != NULL)
			{
				data->addRef();
			}
		}
		return *this;
	}